

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_ls.c
# Opt level: O1

void SetInitialProfiles(N_Vector u,sunrealtype dx,sunrealtype dy)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  lVar3 = N_VGetArrayPointer();
  auVar2 = _DAT_00104050;
  lVar4 = 0;
  dVar11 = (double)DAT_00104050;
  dVar12 = DAT_00104050._8_8_;
  do {
    dVar13 = ((double)(int)lVar4 * dy + 30.0 + -40.0) * 0.1;
    dVar13 = dVar13 * dVar13;
    dVar13 = dVar13 * dVar13 * 0.5 + (1.0 - dVar13);
    lVar5 = -0xa0;
    uVar6 = 0;
    iVar7 = 1;
    do {
      auVar9._4_4_ = 0;
      auVar9._0_4_ = uVar6;
      auVar9._8_4_ = iVar7;
      auVar9._12_4_ = 0;
      dVar8 = ((SUB168(auVar9 | auVar2,0) - dVar11) * dx + 0.0 + -10.0) * 0.1;
      dVar10 = ((SUB168(auVar9 | auVar2,8) - dVar12) * dx + 0.0 + -10.0) * 0.1;
      dVar8 = dVar8 * dVar8;
      dVar10 = dVar10 * dVar10;
      dVar8 = dVar8 * dVar8 * 0.5 + (1.0 - dVar8);
      dVar10 = dVar10 * dVar10 * 0.5 + (1.0 - dVar10);
      pdVar1 = (double *)(lVar3 + 0xb0 + lVar5);
      *pdVar1 = dVar10 * 1000000.0 * dVar13;
      pdVar1[1] = dVar10 * 1000000000000.0 * dVar13;
      pdVar1 = (double *)(lVar3 + 0xa0 + lVar5);
      *pdVar1 = dVar8 * 1000000.0 * dVar13;
      pdVar1[1] = dVar8 * 1000000000000.0 * dVar13;
      uVar6 = uVar6 + 2;
      iVar7 = iVar7 + 2;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0xa0;
  } while (lVar4 != 10);
  return;
}

Assistant:

static void SetInitialProfiles(N_Vector u, sunrealtype dx, sunrealtype dy)
{
  int jx, jy;
  sunrealtype x, y, cx, cy;
  sunrealtype* udata;

  /* Set pointer to data array in vector u. */

  udata = N_VGetArrayPointer(u);

  /* Load initial profiles of c1 and c2 into u vector */

  for (jy = 0; jy < MY; jy++)
  {
    y  = YMIN + jy * dy;
    cy = SQR(SUN_RCONST(0.1) * (y - YMID));
    cy = ONE - cy + SUN_RCONST(0.5) * SQR(cy);
    for (jx = 0; jx < MX; jx++)
    {
      x                       = XMIN + jx * dx;
      cx                      = SQR(SUN_RCONST(0.1) * (x - XMID));
      cx                      = ONE - cx + SUN_RCONST(0.5) * SQR(cx);
      IJKth(udata, 1, jx, jy) = C1_SCALE * cx * cy;
      IJKth(udata, 2, jx, jy) = C2_SCALE * cx * cy;
    }
  }
}